

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int map_set_key_compare_function(map *map,map_key_compare_function_t function)

{
  int iVar1;
  
  iVar1 = -1;
  if (map->bucket_count == 0) {
    map->key_compare_function = function;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int map_set_key_compare_function(struct map *map, map_key_compare_function_t function)
{
        if (map->bucket_count > 0) {
                // Since we have added entries we can't change how we compare
                // keys
                return -1;
        }

        map->key_compare_function = function;

        return 0;
}